

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cxx
# Opt level: O1

char * __thiscall nuraft::buffer::get_str(buffer *this)

{
  uint uVar1;
  buffer *pbVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  buffer *pbVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  uVar1 = *(uint *)this;
  if ((int)uVar1 < 0) {
    uVar3 = *(uint *)(this + 4);
  }
  else {
    uVar3 = (uint)*(ushort *)(this + 2);
  }
  uVar4 = (ulong)uVar3;
  if ((int)uVar1 < 0) {
    uVar6 = uVar1 & 0x7fffffff;
  }
  else {
    uVar6 = (uint)*(ushort *)this;
  }
  uVar8 = (ulong)uVar6;
  if ((int)uVar1 < 0) {
    lVar10 = (ulong)*(uint *)(this + 4) + 8;
  }
  else {
    lVar10 = (ulong)*(ushort *)(this + 2) + 4;
  }
  pbVar7 = this + lVar10;
  if (uVar3 < uVar6) {
    lVar10 = uVar8 - uVar4;
    lVar9 = 0;
    do {
      if (pbVar7[lVar9] == (buffer)0x0) {
        uVar5 = uVar4 + lVar9;
        lVar10 = lVar9;
        break;
      }
      lVar9 = lVar9 + 1;
      uVar5 = uVar8;
    } while ((uVar4 - uVar8) + lVar9 != 0);
  }
  else {
    lVar10 = 0;
    uVar5 = uVar4;
  }
  if (lVar10 == 0) {
    if ((int)uVar1 < 0) {
      *(int *)(this + 4) = *(int *)(this + 4) + 1;
    }
    else {
      *(short *)(this + 2) = *(short *)(this + 2) + 1;
    }
  }
  pbVar2 = (buffer *)0x0;
  if ((lVar10 != 0) && (uVar5 < uVar8)) {
    pbVar2 = pbVar7;
    if (*(int *)this < 0) {
      *(int *)(this + 4) = *(int *)(this + 4) + (int)lVar10 + 1;
    }
    else {
      *(short *)(this + 2) = (short)lVar10 + *(short *)(this + 2) + 1;
    }
  }
  return (char *)pbVar2;
}

Assistant:

size_t buffer::pos() const {
    return (size_t)( __pos_of_block(this) );
}